

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QListWidgetItem * __thiscall QListWidget::itemAt(QListWidget *this,QPoint *p)

{
  QListModel *pQVar1;
  QListWidgetItem *pQVar2;
  long in_FS_OFFSET;
  int local_40 [6];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QListWidgetPrivate::listModel
                     (*(QListWidgetPrivate **)
                       &(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                        super_QFrame.super_QWidget.field_0x8);
  (**(code **)(*(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x1f0))(local_40,this,p);
  if ((ulong)(long)local_40[0] < (ulong)(pQVar1->items).d.size) {
    pQVar2 = (pQVar1->items).d.ptr[local_40[0]];
  }
  else {
    pQVar2 = (QListWidgetItem *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem *QListWidget::itemAt(const QPoint &p) const
{
    Q_D(const QListWidget);
    return d->listModel()->at(indexAt(p).row());

}